

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_read1(BGZF *fp,bam1_t *b)

{
  ssize_t sVar1;
  uint8_t *__ptr;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int32_t block_len;
  uint32_t x [8];
  
  sVar1 = bgzf_read(fp,&block_len,4);
  if ((int)sVar1 == 0) {
    iVar5 = -1;
  }
  else if ((int)sVar1 == 4) {
    sVar1 = bgzf_read(fp,x,0x20);
    if (sVar1 == 0x20) {
      if ((fp->field_0x2 & 0xc) != 0) {
        block_len = (uint)block_len >> 0x18 | (block_len & 0xff0000U) >> 8 |
                    (block_len & 0xff00U) << 8 | block_len << 0x18;
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
          uVar2 = x[lVar4];
          x[lVar4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
          ;
        }
      }
      (b->core).tid = x[0];
      (b->core).pos = x[1];
      *(ulong *)&(b->core).field_0x8 =
           (ulong)x[3] << 0x30 | (ulong)(x[3] >> 0x10) << 0x20 |
           (ulong)(x[2] << 0x18 | (x[2] & 0xff00) << 8 | x[2] >> 0x10);
      (b->core).l_qseq = x[4];
      (b->core).mtid = x[5];
      (b->core).mpos = x[6];
      (b->core).isize = x[7];
      uVar2 = block_len - 0x20;
      b->l_data = uVar2;
      iVar5 = -4;
      if ((-1 < (int)x[4] && 0x1f < block_len) &&
         (__ptr = b->data,
         (ulong)x[4] + (ulong)(x[2] & 0xff) + (ulong)(ushort)x[3] * 4 + (ulong)(x[4] + 1 >> 1) <=
         (ulong)uVar2)) {
        if (b->m_data < (int)uVar2) {
          uVar2 = (int)(block_len - 0x21U) >> 1 | block_len - 0x21U;
          uVar2 = (int)uVar2 >> 2 | uVar2;
          uVar2 = (int)uVar2 >> 4 | uVar2;
          uVar2 = (int)uVar2 >> 8 | uVar2;
          iVar3 = ((int)uVar2 >> 0x10 | uVar2) + 1;
          b->m_data = iVar3;
          __ptr = (uint8_t *)realloc(__ptr,(long)iVar3);
          b->data = __ptr;
          if (__ptr == (uint8_t *)0x0) {
            return -4;
          }
          uVar2 = b->l_data;
        }
        sVar1 = bgzf_read(fp,__ptr,(long)(int)uVar2);
        if (sVar1 == b->l_data) {
          if ((fp->field_0x2 & 0xc) != 0) {
            swap_data(&b->core,b->l_data,b->data,0);
          }
          iVar5 = block_len + 4;
        }
      }
    }
    else {
      iVar5 = -3;
    }
  }
  else {
    iVar5 = -2;
  }
  return iVar5;
}

Assistant:

int bam_read1(BGZF *fp, bam1_t *b)
{
    bam1_core_t *c = &b->core;
    int32_t block_len, ret, i;
    uint32_t x[8];
    if ((ret = bgzf_read(fp, &block_len, 4)) != 4) {
        if (ret == 0) return -1; // normal end-of-file
        else return -2; // truncated
    }
    if (bgzf_read(fp, x, 32) != 32) return -3;
    if (fp->is_be) {
        ed_swap_4p(&block_len);
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
    }
    c->tid = x[0]; c->pos = x[1];
    c->bin = x[2]>>16; c->qual = x[2]>>8&0xff; c->l_qname = x[2]&0xff;
    c->flag = x[3]>>16; c->n_cigar = x[3]&0xffff;
    c->l_qseq = x[4];
    c->mtid = x[5]; c->mpos = x[6]; c->isize = x[7];
    b->l_data = block_len - 32;
    if (b->l_data < 0 || c->l_qseq < 0) return -4;
    if ((char *)bam_get_aux(b) - (char *)b->data > b->l_data)
        return -4;
    if (b->m_data < b->l_data) {
        b->m_data = b->l_data;
        kroundup32(b->m_data);
        b->data = (uint8_t*)realloc(b->data, b->m_data);
        if (!b->data)
            return -4;
    }
    if (bgzf_read(fp, b->data, b->l_data) != b->l_data) return -4;
    //b->l_aux = b->l_data - c->n_cigar * 4 - c->l_qname - c->l_qseq - (c->l_qseq+1)/2;
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return 4 + block_len;
}